

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void impute_missing_values_internal<float,long,long_double>
               (float *numeric_data,int *categ_data,bool is_col_major,float *Xr,long *Xr_ind,
               long *Xr_indptr,size_t nrows,int nthreads,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,Imputer *imputer)

{
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar1;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *pvVar2;
  size_t sVar3;
  unsigned_long uVar4;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *pvVar5;
  size_t row;
  size_t sVar6;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane;
  pointer puVar7;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *__range4_1;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree_00;
  size_t row_1;
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar8;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *__range4;
  exception_ptr ex;
  vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
  imp_memory;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  double temp;
  PredictionData<float,_long> local_98;
  
  local_98.nrows = nrows;
  local_98.ncols_numeric = imputer->ncols_numeric;
  local_98.ncols_categ = imputer->ncols_categ;
  local_98.Xc_indptr = (long *)0x0;
  local_98.Xc = (float *)0x0;
  local_98.Xc_ind = (long *)0x0;
  local_98.numeric_data = numeric_data;
  local_98.categ_data = categ_data;
  local_98.is_col_major = is_col_major;
  local_98.Xr = Xr;
  local_98.Xr_ind = Xr_ind;
  local_98.Xr_indptr = Xr_indptr;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&ix_arr,nrows,(allocator_type *)&imp_memory);
  uVar4 = 0;
  for (puVar7 = ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 != ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    *puVar7 = uVar4;
    uVar4 = uVar4 + 1;
  }
  sVar3 = check_for_missing<PredictionData<float,long>>
                    (&local_98,imputer,
                     ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,nthreads);
  if (sVar3 != 0) {
    std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
    vector(&imp_memory,1,(allocator_type *)&ex);
    ex._M_exception_object = (void *)0x0;
    if (model_outputs == (IsoForest *)0x0) {
      for (sVar6 = 0; sVar6 != sVar3; sVar6 = sVar6 + 1) {
        initialize_impute_calc<ImputedData<long,long_double>,PredictionData<float,long>>
                  (imp_memory.
                   super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_98,imputer,
                   ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar6]);
        pvVar2 = (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pvVar5 = (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (hplane = pvVar5; hplane != pvVar2; hplane = hplane + 1) {
          traverse_hplane<PredictionData<float,long>,long,ImputedData<long,long_double>>
                    (hplane,model_outputs_ext,&local_98,&temp,
                     (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
                     (((long)(imputer->imputer_tree).
                             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                      (long)(model_outputs_ext->hplanes).
                            super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) + (long)pvVar5),
                     imp_memory.
                     super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(long *)0x0,(double *)0x0,
                     ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar6]);
          pvVar5 = pvVar5 + 1;
        }
        apply_imputation_results<PredictionData<float,long>,ImputedData<long,long_double>>
                  (&local_98,
                   imp_memory.
                   super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,imputer,
                   ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar6]);
      }
    }
    else {
      for (sVar6 = 0; sVar6 != sVar3; sVar6 = sVar6 + 1) {
        initialize_impute_calc<ImputedData<long,long_double>,PredictionData<float,long>>
                  (imp_memory.
                   super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_98,imputer,
                   ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar6]);
        pvVar1 = (model_outputs->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        tree_00 = (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar8 = tree_00;
        for (; tree_00 != pvVar1; tree_00 = tree_00 + 1) {
          traverse_itree<PredictionData<float,long>,long,ImputedData<long,long_double>>
                    (tree_00,model_outputs,&local_98,
                     (vector<ImputeNode,_std::allocator<ImputeNode>_> *)
                     (((long)(imputer->imputer_tree).
                             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                      (long)(model_outputs->trees).
                            super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) + (long)pvVar8),
                     imp_memory.
                     super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,1.0,
                     ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[sVar6],(long *)0x0,(double *)0x0,0);
          pvVar8 = pvVar8 + 1;
        }
        apply_imputation_results<PredictionData<float,long>,ImputedData<long,long_double>>
                  (&local_98,
                   imp_memory.
                   super__Vector_base<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,imputer,
                   ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar6]);
      }
    }
    std::__exception_ptr::exception_ptr::~exception_ptr(&ex);
    std::vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>::
    ~vector(&imp_memory);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void impute_missing_values_internal(
                           real_t numeric_data[], int categ_data[], bool is_col_major,
                           real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                           size_t nrows, int nthreads,
                           IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                           Imputer &imputer)
{
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, imputer.ncols_numeric, imputer.ncols_categ,
                                      NULL, NULL, NULL,
                                      Xr, Xr_ind, Xr_indptr};

    std::vector<size_t> ix_arr(nrows);
    std::iota(ix_arr.begin(), ix_arr.end(), (size_t) 0);

    size_t end = check_for_missing(prediction_data, imputer, ix_arr.data(), nthreads);

    if (end == 0)
        return;

    if ((size_t)nthreads > end)
        nthreads = (int)end;
    #ifdef _OPENMP
        std::vector<ImputedData<sparse_ix, ldouble_safe>> imp_memory(nthreads);
    #else
        std::vector<ImputedData<sparse_ix, ldouble_safe>> imp_memory(1);
    #endif

    bool threw_exception = false;
    std::exception_ptr ex = NULL;

    if (model_outputs != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(end, imp_memory, prediction_data, model_outputs, ix_arr, imputer, ex, threw_exception)
        for (size_t_for row = 0; row < (decltype(row))end; row++)
        {
            if (threw_exception) continue;
            try
            {
                initialize_impute_calc(imp_memory[omp_get_thread_num()], prediction_data, imputer, ix_arr[row]);

                for (std::vector<IsoTree> &tree : model_outputs->trees)
                {
                    traverse_itree(tree,
                                   *model_outputs,
                                   prediction_data,
                                   &imputer.imputer_tree[&tree - &(model_outputs->trees[0])],
                                   &imp_memory[omp_get_thread_num()],
                                   (double) 1,
                                   ix_arr[row],
                                   (sparse_ix*)NULL,
                                   (double*)NULL,
                                   (size_t) 0);
                }

                apply_imputation_results(prediction_data, imp_memory[omp_get_thread_num()], imputer, (size_t) ix_arr[row]);
            }

            catch(...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }

        }
    }

    else
    {
        double temp;
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
                shared(end, imp_memory, prediction_data, model_outputs_ext, ix_arr, imputer, ex, threw_exception) \
                private(temp)
        for (size_t_for row = 0; row < (decltype(row))end; row++)
        {
            if (threw_exception) continue;
            try
            {
                initialize_impute_calc(imp_memory[omp_get_thread_num()], prediction_data, imputer, ix_arr[row]);

                for (std::vector<IsoHPlane> &hplane : model_outputs_ext->hplanes)
                {
                    traverse_hplane(hplane,
                                    *model_outputs_ext,
                                    prediction_data,
                                    temp,
                                    &imputer.imputer_tree[&hplane - &(model_outputs_ext->hplanes[0])],
                                    &imp_memory[omp_get_thread_num()],
                                    (sparse_ix*)NULL,
                                    (double*)NULL,
                                    ix_arr[row]);
                }

                apply_imputation_results(prediction_data, imp_memory[omp_get_thread_num()], imputer, (size_t) ix_arr[row]);
            }

            catch (...)
            {
                #pragma omp critical
                {
                    if (!threw_exception)
                    {
                        threw_exception = true;
                        ex = std::current_exception();
                    }
                }
            }

        }
    }

    if (threw_exception)
        std::rethrow_exception(ex);
}